

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr(ExceptionOr<kj::Maybe<kj::OwnFd>_> *this)

{
  if (((this->value).ptr.isSet == true) && ((this->value).ptr.field_1.value.ptr.isSet == true)) {
    OwnFd::~OwnFd(&(this->value).ptr.field_1.value.ptr.field_1.value);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}